

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProfileInstrument.cpp
# Opt level: O3

void Js::Profiler::ForEachNode<Js::Profiler::Print(Js::Phase)::__0>
               (Phase tag,TypeNode *node,anon_class_32_4_bc7babac visit,Phase parentTag)

{
  uint uVar1;
  TypeNode *node_00;
  long lVar2;
  long lVar3;
  code *pcVar4;
  bool bVar5;
  TypeNode *child;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  double dVar9;
  undefined4 *local_38;
  
  if (node == (TypeNode *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    local_38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *local_38 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                ,0x1ad,"(node != 0)","Invalid usage: node must always be non null");
    if (!bVar5) {
LAB_003642a0:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *local_38 = 0;
  }
  else {
    local_38 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  uVar7 = 0;
  do {
    node_00 = node->children[uVar7];
    if (node_00 != (TypeNode *)0x0) {
      if (tag == uVar7) {
        if (*visit.foundNode == false) {
          *visit.foundNode = true;
          Output::Print(L"%-*s:%7s %5s %7s %5s %7s %7s %5s\n",0x1b,L"Profiler Report",L"Incl",L"(%)"
                        ,L"Excl",L"(%)",L"Max",L"Mean",L"Count");
          Output::Print(
                       L"-------------------------------------------------------------------------------\n"
                       );
        }
        uVar1 = (node_00->value).count;
        if (uVar1 == 0) {
          Output::Print(L"The phase : %s was never started",(&PhaseNames)[*visit.baseTag]);
        }
        else {
          uVar6 = 0;
          if (parentTag != InvalidPhase) {
            if (node_00->parent == (TreeNode<Js::UnitData,_373> *)0x0) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *local_38 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Core/ProfileInstrument.cpp"
                                          ,0x180,"(parentNode)","parentNode");
              if (!bVar5) goto LAB_003642a0;
              *local_38 = 0;
            }
            Output::Print(L"%-*s\n",0x1b,(&PhaseNames)[parentTag]);
            Output::SkipToColumn(1);
            uVar1 = (node_00->value).count;
            uVar6 = 1;
          }
          lVar2 = (node_00->value).incl;
          lVar3 = (node_00->value).excl;
          dVar8 = (double)lVar2;
          dVar9 = (double)*visit.freq;
          Output::Print(L"%-*s %7.1f %5d %7.1f %5d %7.1f %7.1f %5d\n",dVar8 / dVar9,
                        SUB84((double)lVar3 / dVar9,0),(double)(node_00->value).max / dVar9,
                        dVar8 / (double)(long)((ulong)uVar1 * *visit.freq),(ulong)(uVar6 ^ 0x1b),
                        (&PhaseNames)[*visit.baseTag],100,(lVar3 * 100) / lVar2 & 0xffffffff);
          PrintTree(visit.this,node_00,node_00,uVar6 + 1,*visit.freq);
        }
      }
      else {
        ForEachNode<Js::Profiler::Print(Js::Phase)::__0>(tag,node_00,visit,(Phase)uVar7);
      }
    }
    uVar7 = uVar7 + 1;
    if (uVar7 == 0x175) {
      return;
    }
  } while( true );
}

Assistant:

void
    Profiler::ForEachNode(Phase tag, TypeNode *node, FVisit visit, Phase parentTag)
    {
        AssertMsg(node != NULL, "Invalid usage: node must always be non null");

        for(int i = 0; i < PhaseCount; i++)
        {
            if(node->ChildExistsAt(i))
            {
                TypeNode * child = node->GetChildAt(i);
                if(i == tag)
                {
                    visit(child, parentTag);
                }
                else
                {
                    ForEachNode(tag, child, visit, static_cast<Phase>(i));
                }
            }
        }
    }